

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O3

int32 nextword(char *line,char *delim,char **word,char *delimfound)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  char *w;
  char *pcVar4;
  char *pcVar5;
  
  cVar3 = *line;
  if (cVar3 == '\0') {
    return -1;
  }
  cVar1 = *delim;
  pcVar2 = delim + 1;
  pcVar4 = line;
  pcVar5 = line;
  while (cVar1 != '\0') {
    if (cVar1 == cVar3) {
      cVar3 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      cVar1 = *delim;
      pcVar2 = delim + 1;
      pcVar4 = line;
      if (cVar3 == '\0') {
        return -1;
      }
    }
    else {
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
      pcVar4 = pcVar5;
    }
  }
  *word = pcVar4;
  cVar3 = pcVar4[1];
  pcVar4 = pcVar4 + 1;
  if (cVar3 != '\0') {
    cVar1 = *delim;
    pcVar2 = delim + 1;
    do {
      while (cVar1 != '\0') {
        if (cVar1 == cVar3) goto LAB_001089c2;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
      cVar3 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
      cVar1 = *delim;
      pcVar2 = delim + 1;
    } while (cVar3 != '\0');
  }
  cVar3 = '\0';
LAB_001089c2:
  *delimfound = cVar3;
  *pcVar4 = '\0';
  return (int)pcVar4 - *(int *)word;
}

Assistant:

int32
nextword(char *line, const char *delim, char **word, char *delimfound)
{
    const char *d;
    char *w;

    /* Skip past any preceding delimiters */
    for (w = line; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (!*d)
            break;
    }
    if (!*w)
        return -1;

    *word = w;                  /* Beginning of word */

    /* Skip until first delimiter char */
    for (w++; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (*d)
            break;
    }

    /* Replace delimiter with NULL char, but return the original first */
    *delimfound = *w;
    *w = '\0';

    return (w - *word);
}